

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmMultiAdapterContext::RemoveContext(GmmMultiAdapterContext *this,ADAPTER_BDF sBdf)

{
  Context *this_00;
  int32_t iVar1;
  GMM_ADAPTER_INFO *pNode_00;
  void *ptr;
  int32_t ContextRefCount;
  GMM_ADAPTER_INFO *pNode;
  GMM_STATUS SyncLockStatus;
  GmmMultiAdapterContext *this_local;
  ADAPTER_BDF sBdf_local;
  
  this_local._4_4_ = LockMAContextSyncMutex(this);
  if (this_local._4_4_ == GMM_SUCCESS) {
    ptr = (void *)(ulong)(uint)sBdf.field_0;
    pNode_00 = GetAdapterNodeUnlocked(this,sBdf);
    if (pNode_00 == (GMM_ADAPTER_INFO *)0x0) {
      UnLockMAContextSyncMutex(this);
      this_local._4_4_ = GMM_ERROR;
    }
    else {
      if (pNode_00->pGmmLibContext == (Context *)0x0) {
        RemoveAdapterNode(this,pNode_00);
      }
      else {
        iVar1 = Context::DecrementRefCount(pNode_00->pGmmLibContext);
        if (iVar1 == 0) {
          Context::DestroyContext(pNode_00->pGmmLibContext);
          this_00 = pNode_00->pGmmLibContext;
          if (this_00 != (Context *)0x0) {
            Context::~Context(this_00);
            GmmMemAllocator::operator_delete((GmmMemAllocator *)this_00,ptr);
          }
          RemoveAdapterNode(this,pNode_00);
        }
      }
      UnLockMAContextSyncMutex(this);
      this_local._4_4_ = GMM_SUCCESS;
    }
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmMultiAdapterContext::RemoveContext(ADAPTER_BDF sBdf)
{
    GMM_STATUS SyncLockStatus = LockMAContextSyncMutex();

    if (SyncLockStatus != GMM_SUCCESS)
    {
        return SyncLockStatus;
    }

    GmmLib::GMM_ADAPTER_INFO *pNode = GetAdapterNodeUnlocked(sBdf);
    GMM_LIB_ASSERT(pNode);
    if (!pNode)
    {
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

    if (pNode->pGmmLibContext)
    {
        int32_t ContextRefCount = pNode->pGmmLibContext->DecrementRefCount();
        // Refount = 0, It means that it the last client on this adapter
        // Lets free the LibContext and the Adapter Node
        if (!ContextRefCount)
        {
            pNode->pGmmLibContext->DestroyContext();
            // Delete/free the LibContext object
            delete pNode->pGmmLibContext;

            // Delete/free the AdapterNode from the Linked List
            RemoveAdapterNode(pNode);
            pNode = NULL;
        }
    }
    else
    {
        // No context exists for this node. Just remove it.
        RemoveAdapterNode(pNode);
        pNode = NULL;
    }

    UnLockMAContextSyncMutex();

    return GMM_SUCCESS;
}